

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetSuffledPicturePaths.h
# Opt level: O2

bool GetShuffledPicturePaths::isImageFile(string *str)

{
  size_type sVar1;
  size_type sVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  pointer pbVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *supportedExtension;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70 [32];
  string imagePath;
  
  toLowerCase(&imagePath,str);
  if (isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_ == '\0') {
    iVar5 = __cxa_guard_acquire(&isImageFile(std::__cxx11::string_const&)::
                                 supportedImageExtensions_abi_cxx11_);
    if (iVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,".jpg",&local_91);
      std::__cxx11::string::string<std::allocator<char>>(local_70,".png",&local_92);
      __l._M_len = 2;
      __l._M_array = &local_90;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,__l,
               &local_93);
      lVar7 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar7));
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isImageFile(std::__cxx11::string_const&)::
                           supportedImageExtensions_abi_cxx11_);
    }
  }
  pbVar3 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = isImageFile(std::__cxx11::string_const&)::supportedImageExtensions_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar6 = pbVar4;
    if (pbVar6 == pbVar3) break;
    toLowerCase(&local_90,str);
    lVar7 = std::__cxx11::string::find((string *)&local_90,(ulong)pbVar6);
    sVar1 = str->_M_string_length;
    sVar2 = pbVar6->_M_string_length;
    std::__cxx11::string::~string((string *)&local_90);
    pbVar4 = pbVar6 + 1;
  } while (lVar7 != sVar1 - sVar2);
  std::__cxx11::string::~string((string *)&imagePath);
  return pbVar6 != pbVar3;
}

Assistant:

bool isImageFile(const std::string& str)
    {
        std::string imagePath = toLowerCase(str);

        static const std::vector<std::string> supportedImageExtensions = {".jpg", ".png"};
        for(const auto& supportedExtension : supportedImageExtensions) {
            if (toLowerCase(str).find(supportedExtension) == str.size() - supportedExtension.size()){
                return true;
            }
        }
        return false;
    }